

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O0

HouseholderSequenceType * __thiscall
Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixQ
          (HouseholderSequenceType *__return_storage_ptr__,
          HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  ConjugateReturnType h;
  Index IVar1;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *pHVar2;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  local_40;
  HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = this;
  this_local = (HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               __return_storage_ptr__;
  if ((this->m_isInitialized & 1U) == 0) {
    __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                  ,0xec,
                  "HouseholderSequenceType Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::matrixQ() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  h = DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conjugate
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_hCoeffs);
  HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
  ::HouseholderSequence(&local_40,&this->m_matrix,h);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  pHVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
           ::setLength(&local_40,IVar1 + -1);
  pHVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
           ::setShift(pHVar2,1);
  HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
  ::HouseholderSequence(__return_storage_ptr__,pHVar2);
  return __return_storage_ptr__;
}

Assistant:

HouseholderSequenceType matrixQ() const
    {
      eigen_assert(m_isInitialized && "HessenbergDecomposition is not initialized.");
      return HouseholderSequenceType(m_matrix, m_hCoeffs.conjugate())
             .setLength(m_matrix.rows() - 1)
             .setShift(1);
    }